

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_Stop(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *pAVar1;
  undefined1 local_48 [8];
  TActorIterator<AActor> iterator;
  bool ok;
  AActor *target;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.super_FActorIterator._15_1_ = 0;
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      TVector3<double>::Zero(&it->Vel);
      if (it->player != (player_t *)0x0) {
        TVector2<double>::Zero(&it->player->Vel);
      }
      iterator.super_FActorIterator._15_1_ = 1;
    }
  }
  else {
    TActorIterator<AActor>::TActorIterator((TActorIterator<AActor> *)local_48,arg0);
    while (pAVar1 = TActorIterator<AActor>::Next((TActorIterator<AActor> *)local_48),
          pAVar1 != (AActor *)0x0) {
      TVector3<double>::Zero(&pAVar1->Vel);
      if (pAVar1->player != (player_t *)0x0) {
        TVector2<double>::Zero(&pAVar1->player->Vel);
      }
      iterator.super_FActorIterator._15_1_ = 1;
    }
  }
  return (int)(iterator.super_FActorIterator._15_1_ & 1);
}

Assistant:

FUNC(LS_Thing_Stop)
// Thing_Stop(tid)
{
	AActor * target;
	bool ok = false;

	if (arg0==0)
	{
		if (it != NULL)
		{
			it->Vel.Zero();
			if (it->player != NULL) it->player->Vel.Zero();
			ok = true;
		}
	}
	else
	{
		TActorIterator<AActor> iterator (arg0);

		while ( (target = iterator.Next ()) )
		{
			target->Vel.Zero();
			if (target->player != NULL) target->player->Vel.Zero();
			ok = true;
		}
	}
	return ok;
}